

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_hashmap.c
# Opt level: O3

SUNErrCode SUNHashMap_Destroy(SUNHashMap *map)

{
  SUNStlVector_SUNHashMapKeyValue __ptr;
  SUNErrCode SVar1;
  long lVar2;
  long lVar3;
  SUNHashMap __ptr_00;
  
  if (map != (SUNHashMap *)0x0) {
    __ptr_00 = *map;
    __ptr = __ptr_00->buckets;
    if (__ptr != (SUNStlVector_SUNHashMapKeyValue)0x0) {
      if (0 < __ptr->size) {
        lVar3 = 0;
        lVar2 = 0;
        do {
          SVar1 = (*__ptr->destroyValue)((SUNHashMapKeyValue *)((long)__ptr->values + lVar3));
          if (SVar1 != 0) {
            return SVar1;
          }
          __ptr->values[lVar2] = (SUNHashMapKeyValue)0x0;
          lVar2 = lVar2 + 1;
          lVar3 = lVar3 + 8;
        } while (lVar2 < __ptr->size);
      }
      free(__ptr->values);
      free(__ptr);
      __ptr_00->buckets = (SUNStlVector_SUNHashMapKeyValue)0x0;
      __ptr_00 = *map;
    }
    free(__ptr_00);
    *map = (SUNHashMap)0x0;
  }
  return 0;
}

Assistant:

SUNErrCode SUNHashMap_Destroy(SUNHashMap* map)
{
  if (map == NULL) { return SUN_SUCCESS; }

  SUNErrCode err = SUNStlVector_SUNHashMapKeyValue_Destroy(&(*map)->buckets);
  if (err) { return err; }
  free(*map);
  *map = NULL;

  return SUN_SUCCESS;
}